

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

void SplitByteVectorDistance
               (MemoryManager *m,uint16_t *data,size_t length,size_t literals_per_histogram,
               size_t max_histograms,size_t sampling_stride_length,double block_switch_cost,
               BrotliEncoderParams *params,BlockSplit *split)

{
  int iVar1;
  ulong uVar2;
  uint16_t *local_110;
  uint8_t *local_108;
  double *local_100;
  double *local_f8;
  uint8_t *local_f0;
  HistogramDistance *local_e8;
  uint32_t *local_e0;
  uint32_t *local_d8;
  uint8_t *local_d0;
  uint8_t *local_c8;
  ulong local_c0;
  size_t i;
  size_t iters;
  uint16_t *new_id;
  uint8_t *switch_signal;
  double *cost;
  double *insert_cost;
  size_t bitmaplen;
  size_t num_blocks;
  uint8_t *block_ids;
  uint32_t *new_array_1;
  size_t _new_size_1;
  uint8_t *new_array;
  size_t _new_size;
  HistogramDistance *histograms;
  size_t num_histograms;
  size_t data_size;
  double block_switch_cost_local;
  size_t sampling_stride_length_local;
  size_t max_histograms_local;
  size_t literals_per_histogram_local;
  size_t length_local;
  uint16_t *data_local;
  MemoryManager *m_local;
  
  histograms = (HistogramDistance *)(length / literals_per_histogram + 1);
  if (max_histograms < histograms) {
    histograms = (HistogramDistance *)max_histograms;
  }
  if (length == 0) {
    split->num_types = 1;
  }
  else if (length < 0x80) {
    if (split->types_alloc_size < split->num_blocks + 1) {
      if (split->types_alloc_size == 0) {
        local_c8 = (uint8_t *)(split->num_blocks + 1);
      }
      else {
        local_c8 = (uint8_t *)split->types_alloc_size;
      }
      for (new_array = local_c8; new_array < (uint8_t *)(split->num_blocks + 1);
          new_array = (uint8_t *)((long)new_array << 1)) {
      }
      if (new_array == (uint8_t *)0x0) {
        local_d0 = (uint8_t *)0x0;
      }
      else {
        local_d0 = (uint8_t *)BrotliAllocate(m,(size_t)new_array);
      }
      if (split->types_alloc_size != 0) {
        memcpy(local_d0,split->types,split->types_alloc_size);
      }
      BrotliFree(m,split->types);
      split->types = (uint8_t *)0x0;
      split->types = local_d0;
      split->types_alloc_size = (size_t)new_array;
    }
    if (split->lengths_alloc_size < split->num_blocks + 1) {
      if (split->lengths_alloc_size == 0) {
        local_d8 = (uint32_t *)(split->num_blocks + 1);
      }
      else {
        local_d8 = (uint32_t *)split->lengths_alloc_size;
      }
      for (new_array_1 = local_d8; new_array_1 < (uint32_t *)(split->num_blocks + 1);
          new_array_1 = (uint32_t *)((long)new_array_1 << 1)) {
      }
      if (new_array_1 == (uint32_t *)0x0) {
        local_e0 = (uint32_t *)0x0;
      }
      else {
        local_e0 = (uint32_t *)BrotliAllocate(m,(long)new_array_1 << 2);
      }
      if (split->lengths_alloc_size != 0) {
        memcpy(local_e0,split->lengths,split->lengths_alloc_size << 2);
      }
      BrotliFree(m,split->lengths);
      split->lengths = (uint32_t *)0x0;
      split->lengths = local_e0;
      split->lengths_alloc_size = (size_t)new_array_1;
    }
    split->num_types = 1;
    split->types[split->num_blocks] = '\0';
    split->lengths[split->num_blocks] = (uint32_t)length;
    split->num_blocks = split->num_blocks + 1;
  }
  else {
    if (histograms == (HistogramDistance *)0x0) {
      local_e8 = (HistogramDistance *)0x0;
    }
    else {
      local_e8 = (HistogramDistance *)BrotliAllocate(m,(long)histograms * 0x890);
    }
    InitialEntropyCodesDistance(data,length,sampling_stride_length,(size_t)histograms,local_e8);
    RefineEntropyCodesDistance(data,length,sampling_stride_length,(size_t)histograms,local_e8);
    if (length == 0) {
      local_f0 = (uint8_t *)0x0;
    }
    else {
      local_f0 = (uint8_t *)BrotliAllocate(m,length);
    }
    bitmaplen = 0;
    uVar2 = (ulong)((long)histograms->data_ + 7U) >> 3;
    if ((long)histograms * 0x220 == 0) {
      local_f8 = (double *)0x0;
    }
    else {
      local_f8 = (double *)BrotliAllocate(m,(long)histograms * 0x1100);
    }
    if (histograms == (HistogramDistance *)0x0) {
      local_100 = (double *)0x0;
    }
    else {
      local_100 = (double *)BrotliAllocate(m,(long)histograms << 3);
    }
    if (length * uVar2 == 0) {
      local_108 = (uint8_t *)0x0;
    }
    else {
      local_108 = (uint8_t *)BrotliAllocate(m,length * uVar2);
    }
    if (histograms == (HistogramDistance *)0x0) {
      local_110 = (uint16_t *)0x0;
    }
    else {
      local_110 = (uint16_t *)BrotliAllocate(m,(long)histograms << 1);
    }
    iVar1 = 10;
    if (params->quality < 0xb) {
      iVar1 = 3;
    }
    for (local_c0 = 0; local_c0 < (ulong)(long)iVar1; local_c0 = local_c0 + 1) {
      bitmaplen = FindBlocksDistance(data,length,block_switch_cost,(size_t)histograms,local_e8,
                                     local_f8,local_100,local_108,local_f0);
      histograms = (HistogramDistance *)
                   RemapBlockIdsDistance(local_f0,length,local_110,(size_t)histograms);
      BuildBlockHistogramsDistance(data,length,local_f0,(size_t)histograms,local_e8);
    }
    BrotliFree(m,local_f8);
    BrotliFree(m,local_100);
    BrotliFree(m,local_108);
    BrotliFree(m,local_110);
    BrotliFree(m,local_e8);
    ClusterBlocksDistance(m,data,length,bitmaplen,local_f0,split);
    BrotliFree(m,local_f0);
  }
  return;
}

Assistant:

static void FN(SplitByteVector)(MemoryManager* m,
                                const DataType* data, const size_t length,
                                const size_t literals_per_histogram,
                                const size_t max_histograms,
                                const size_t sampling_stride_length,
                                const double block_switch_cost,
                                const BrotliEncoderParams* params,
                                BlockSplit* split) {
  const size_t data_size = FN(HistogramDataSize)();
  size_t num_histograms = length / literals_per_histogram + 1;
  HistogramType* histograms;
  if (num_histograms > max_histograms) {
    num_histograms = max_histograms;
  }
  if (length == 0) {
    split->num_types = 1;
    return;
  } else if (length < kMinLengthForBlockSplitting) {
    BROTLI_ENSURE_CAPACITY(m, uint8_t,
        split->types, split->types_alloc_size, split->num_blocks + 1);
    BROTLI_ENSURE_CAPACITY(m, uint32_t,
        split->lengths, split->lengths_alloc_size, split->num_blocks + 1);
    if (BROTLI_IS_OOM(m)) return;
    split->num_types = 1;
    split->types[split->num_blocks] = 0;
    split->lengths[split->num_blocks] = (uint32_t)length;
    split->num_blocks++;
    return;
  }
  histograms = BROTLI_ALLOC(m, HistogramType, num_histograms);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(histograms)) return;
  /* Find good entropy codes. */
  FN(InitialEntropyCodes)(data, length,
                          sampling_stride_length,
                          num_histograms, histograms);
  FN(RefineEntropyCodes)(data, length,
                         sampling_stride_length,
                         num_histograms, histograms);
  {
    /* Find a good path through literals with the good entropy codes. */
    uint8_t* block_ids = BROTLI_ALLOC(m, uint8_t, length);
    size_t num_blocks = 0;
    const size_t bitmaplen = (num_histograms + 7) >> 3;
    double* insert_cost = BROTLI_ALLOC(m, double, data_size * num_histograms);
    double* cost = BROTLI_ALLOC(m, double, num_histograms);
    uint8_t* switch_signal = BROTLI_ALLOC(m, uint8_t, length * bitmaplen);
    uint16_t* new_id = BROTLI_ALLOC(m, uint16_t, num_histograms);
    const size_t iters = params->quality < HQ_ZOPFLIFICATION_QUALITY ? 3 : 10;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(block_ids) ||
        BROTLI_IS_NULL(insert_cost) || BROTLI_IS_NULL(cost) ||
        BROTLI_IS_NULL(switch_signal) || BROTLI_IS_NULL(new_id)) {
      return;
    }
    for (i = 0; i < iters; ++i) {
      num_blocks = FN(FindBlocks)(data, length,
                                  block_switch_cost,
                                  num_histograms, histograms,
                                  insert_cost, cost, switch_signal,
                                  block_ids);
      num_histograms = FN(RemapBlockIds)(block_ids, length,
                                         new_id, num_histograms);
      FN(BuildBlockHistograms)(data, length, block_ids,
                               num_histograms, histograms);
    }
    BROTLI_FREE(m, insert_cost);
    BROTLI_FREE(m, cost);
    BROTLI_FREE(m, switch_signal);
    BROTLI_FREE(m, new_id);
    BROTLI_FREE(m, histograms);
    FN(ClusterBlocks)(m, data, length, num_blocks, block_ids, split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, block_ids);
  }
}